

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guiddatabase.cpp
# Opt level: O2

USTATUS guidDatabaseExportToFile(CBString *outPath,GuidDatabase *db)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  USTATUS UVar3;
  _Self __tmp;
  allocator local_271;
  string name;
  string guid;
  ofstream outputFile;
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&outputFile,(char *)(outPath->super_tagbstring).data,_S_trunc|_S_out);
  if ((abStack_210[*(long *)(_outputFile + -0x18)] & 5) == 0) {
    for (p_Var2 = (db->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(db->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      guidToUString((CBString *)&name,(EFI_GUID *)(p_Var2 + 1),false);
      std::__cxx11::string::string
                ((string *)&guid,(char *)name.field_2._M_allocated_capacity,&local_271);
      Bstrlib::CBString::~CBString((CBString *)&name);
      std::__cxx11::string::string((string *)&name,*(char **)(p_Var2 + 2),&local_271);
      poVar1 = std::operator<<((ostream *)&outputFile,(string *)&guid);
      poVar1 = std::operator<<(poVar1,',');
      poVar1 = std::operator<<(poVar1,(string *)&name);
      std::operator<<(poVar1,'\n');
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&guid);
    }
    UVar3 = 0;
  }
  else {
    UVar3 = 5;
  }
  std::ofstream::~ofstream(&outputFile);
  return UVar3;
}

Assistant:

USTATUS guidDatabaseExportToFile(const UString & outPath, GuidDatabase & db)
{
    std::ofstream outputFile(outPath.toLocal8Bit(), std::ios::out | std::ios::trunc);
    if (!outputFile)
        return U_FILE_OPEN;
    for (GuidDatabase::iterator it = db.begin(); it != db.end(); it++) {
        std::string guid(guidToUString (it->first, false).toLocal8Bit());
        std::string name(it->second.toLocal8Bit());
        outputFile << guid << ',' << name << '\n';
    }
    
    return U_SUCCESS;
}